

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getRowName(Highs *this,HighsInt row,string *name)

{
  char *format;
  
  if (row < 0 || (this->model_).lp_.num_row_ <= row) {
    format = "Index %d for row name is outside the range [0, num_row = %d)\n";
  }
  else {
    if (row < (int)((ulong)((long)(this->model_).lp_.row_names_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->model_).lp_.row_names_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      std::__cxx11::string::_M_assign((string *)name);
      return kOk;
    }
    format = "Index %d for row name is outside the range [0, num_row_name = %d)\n";
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
  return kError;
}

Assistant:

HighsStatus Highs::getRowName(const HighsInt row, std::string& name) const {
  const HighsInt num_row = this->model_.lp_.num_row_;
  if (row < 0 || row >= num_row) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name is outside the range [0, num_row = %d)\n",
        int(row), int(num_row));
    return HighsStatus::kError;
  }
  const HighsInt num_row_name = this->model_.lp_.row_names_.size();
  if (row >= num_row_name) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name is outside the range [0, num_row_name = %d)\n",
        int(row), int(num_row_name));
    return HighsStatus::kError;
  }
  name = this->model_.lp_.row_names_[row];
  return HighsStatus::kOk;
}